

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void idtx16x16_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  __m128i *palVar1;
  undefined1 auVar2 [16];
  int local_110;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int i;
  int num_iters;
  __m128i a_low;
  __m128i offset;
  __m128i fact;
  int col_num_local;
  int bit_local;
  __m128i *out_local;
  __m128i *in_local;
  
  for (local_110 = 0; local_110 < col_num << 4; local_110 = local_110 + 1) {
    auVar2._8_8_ = 0x2d4200002d42;
    auVar2._0_8_ = 0x2d4200002d42;
    auVar2 = pmulld((undefined1  [16])in[local_110],auVar2);
    local_a8 = auVar2._0_4_;
    iStack_a4 = auVar2._4_4_;
    iStack_a0 = auVar2._8_4_;
    iStack_9c = auVar2._12_4_;
    auVar2 = ZEXT416(0xc);
    palVar1 = out + local_110;
    *(int *)*palVar1 = local_a8 + 0x800 >> auVar2;
    *(int *)((long)*palVar1 + 4) = iStack_a4 + 0x800 >> auVar2;
    *(int *)(*palVar1 + 1) = iStack_a0 + 0x800 >> auVar2;
    *(int *)((long)*palVar1 + 0xc) = iStack_9c + 0x800 >> auVar2;
  }
  return;
}

Assistant:

static void idtx16x16_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;
  __m128i fact = _mm_set1_epi32(2 * NewSqrt2);
  __m128i offset = _mm_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m128i a_low;

  int num_iters = 16 * col_num;
  for (int i = 0; i < num_iters; i++) {
    a_low = _mm_mullo_epi32(in[i], fact);
    a_low = _mm_add_epi32(a_low, offset);
    out[i] = _mm_srai_epi32(a_low, NewSqrt2Bits);
  }
}